

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateLeaOfOOPData
          (Lowerer *this,RegOpnd *regOpnd,void *address,int32 offset,Instr *instrInsert)

{
  void *dst;
  uint left;
  Func *this_00;
  StackSym *sym;
  RegOpnd *baseOpnd;
  char16 *desc;
  IndirOpnd *src;
  int32 local_3c;
  Func *pFStack_38;
  int32 dataOffset;
  Func *func;
  Instr *instrInsert_local;
  void *pvStack_20;
  int32 offset_local;
  void *address_local;
  RegOpnd *regOpnd_local;
  Lowerer *this_local;
  
  pFStack_38 = instrInsert->m_func;
  func = (Func *)instrInsert;
  instrInsert_local._4_4_ = offset;
  pvStack_20 = address;
  address_local = regOpnd;
  regOpnd_local = (RegOpnd *)this;
  left = NativeCodeData::GetDataTotalOffset(address);
  Int32Math::Add(left,instrInsert_local._4_4_,&local_3c);
  dst = address_local;
  this_00 = Func::GetTopFunc(pFStack_38);
  sym = Func::GetNativeCodeDataSym(this_00);
  baseOpnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
  desc = NativeCodeData::GetDataDescription(pvStack_20,pFStack_38->m_alloc);
  src = IR::IndirOpnd::New(baseOpnd,local_3c,TyUint64,desc,pFStack_38,true);
  InsertLea((RegOpnd *)dst,&src->super_Opnd,(Instr *)func);
  return;
}

Assistant:

void
Lowerer::GenerateLeaOfOOPData(IR::RegOpnd * regOpnd, void * address, int32 offset, IR::Instr * instrInsert)
{
    Func * func = instrInsert->m_func;
    int32 dataOffset;
    Int32Math::Add(NativeCodeData::GetDataTotalOffset(address), offset, &dataOffset);
    InsertLea(regOpnd,
              IR::IndirOpnd::New(IR::RegOpnd::New(func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), dataOffset, TyMachPtr,
#if DBG
                                 NativeCodeData::GetDataDescription(address, func->m_alloc),
#endif
                                 func, true),
              instrInsert);
}